

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::RegistryTest_reject_different_type_than_summary_Test::TestBody
          (RegistryTest_reject_different_type_than_summary_Test *this)

{
  bool bVar1;
  Builder<prometheus::Summary> *this_00;
  char *message;
  Builder<prometheus::Counter> *this_01;
  Builder<prometheus::Gauge> *this_02;
  Builder<prometheus::Histogram> *this_03;
  Builder<prometheus::Info> *this_04;
  AssertHelper local_408;
  Message local_400;
  Builder<prometheus::Info> local_3f8;
  byte local_381;
  bool gtest_caught_any_3;
  Message local_378;
  Builder<prometheus::Histogram> local_370;
  byte local_2f9;
  bool gtest_caught_any_2;
  Message local_2f0;
  Builder<prometheus::Gauge> local_2e8;
  byte local_271;
  bool gtest_caught_any_1;
  Message local_268;
  Builder<prometheus::Counter> local_260;
  byte local_1e9;
  undefined1 local_1e8 [7];
  bool gtest_caught_any;
  AssertHelper local_1c8;
  Message local_1c0 [6];
  exception *e;
  Builder<prometheus::Summary> local_188;
  undefined1 local_118 [8];
  TrueWithString gtest_msg;
  Registry registry;
  allocator local_31;
  undefined1 local_30 [8];
  string same_name;
  RegistryTest_reject_different_type_than_summary_Test *this_local;
  
  same_name.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"same_name",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  Registry::Registry((Registry *)((long)&gtest_msg.value.field_2 + 8),Merge);
  memset(local_118,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)local_118);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)local_118);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      BuildSummary();
      this_00 = detail::Builder<prometheus::Summary>::Name(&local_188,(string *)local_30);
      detail::Builder<prometheus::Summary>::Register
                (this_00,(Registry *)((long)&gtest_msg.value.field_2 + 8));
      detail::Builder<prometheus::Summary>::~Builder(&local_188);
    }
  }
  else {
    testing::Message::Message(local_1c0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                   "Expected: BuildSummary().Name(same_name).Register(registry) doesn\'t throw an exception.\n  Actual: "
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/registry_test.cc"
               ,0x6b,message);
    testing::internal::AssertHelper::operator=(&local_1c8,local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    std::__cxx11::string::~string((string *)local_1e8);
    testing::Message::~Message(local_1c0);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)local_118);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_1e9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      BuildCounter();
      this_01 = detail::Builder<prometheus::Counter>::Name(&local_260,(string *)local_30);
      detail::Builder<prometheus::Counter>::Register
                (this_01,(Registry *)((long)&gtest_msg.value.field_2 + 8));
      detail::Builder<prometheus::Counter>::~Builder(&local_260);
    }
    if ((local_1e9 & 1) == 0) goto LAB_0015e42b;
  }
  else {
LAB_0015e42b:
    testing::Message::Message(&local_268);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffd90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/registry_test.cc"
               ,0x6c,
               "Expected: BuildCounter().Name(same_name).Register(registry) throws an exception.\n  Actual: it doesn\'t."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffd90,&local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd90);
    testing::Message::~Message(&local_268);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_271 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      BuildGauge();
      this_02 = detail::Builder<prometheus::Gauge>::Name(&local_2e8,(string *)local_30);
      detail::Builder<prometheus::Gauge>::Register
                (this_02,(Registry *)((long)&gtest_msg.value.field_2 + 8));
      detail::Builder<prometheus::Gauge>::~Builder(&local_2e8);
    }
    if ((local_271 & 1) == 0) goto LAB_0015e5a3;
  }
  else {
LAB_0015e5a3:
    testing::Message::Message(&local_2f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffd08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/registry_test.cc"
               ,0x6d,
               "Expected: BuildGauge().Name(same_name).Register(registry) throws an exception.\n  Actual: it doesn\'t."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffd08,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd08);
    testing::Message::~Message(&local_2f0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_2f9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      BuildHistogram();
      this_03 = detail::Builder<prometheus::Histogram>::Name(&local_370,(string *)local_30);
      detail::Builder<prometheus::Histogram>::Register
                (this_03,(Registry *)((long)&gtest_msg.value.field_2 + 8));
      detail::Builder<prometheus::Histogram>::~Builder(&local_370);
    }
    if ((local_2f9 & 1) == 0) goto LAB_0015e71b;
  }
  else {
LAB_0015e71b:
    testing::Message::Message(&local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffc80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/registry_test.cc"
               ,0x6e,
               "Expected: BuildHistogram().Name(same_name).Register(registry) throws an exception.\n  Actual: it doesn\'t."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffc80,&local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffc80);
    testing::Message::~Message(&local_378);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_381 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      BuildInfo();
      this_04 = detail::Builder<prometheus::Info>::Name(&local_3f8,(string *)local_30);
      detail::Builder<prometheus::Info>::Register
                (this_04,(Registry *)((long)&gtest_msg.value.field_2 + 8));
      detail::Builder<prometheus::Info>::~Builder(&local_3f8);
    }
    if ((local_381 & 1) != 0) goto LAB_0015e92a;
  }
  testing::Message::Message(&local_400);
  testing::internal::AssertHelper::AssertHelper
            (&local_408,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/registry_test.cc"
             ,0x6f,
             "Expected: BuildInfo().Name(same_name).Register(registry) throws an exception.\n  Actual: it doesn\'t."
            );
  testing::internal::AssertHelper::operator=(&local_408,&local_400);
  testing::internal::AssertHelper::~AssertHelper(&local_408);
  testing::Message::~Message(&local_400);
LAB_0015e92a:
  Registry::~Registry((Registry *)((long)&gtest_msg.value.field_2 + 8));
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(RegistryTest, reject_different_type_than_summary) {
  const auto same_name = std::string{"same_name"};
  Registry registry{};

  EXPECT_NO_THROW(BuildSummary().Name(same_name).Register(registry));
  EXPECT_ANY_THROW(BuildCounter().Name(same_name).Register(registry));
  EXPECT_ANY_THROW(BuildGauge().Name(same_name).Register(registry));
  EXPECT_ANY_THROW(BuildHistogram().Name(same_name).Register(registry));
  EXPECT_ANY_THROW(BuildInfo().Name(same_name).Register(registry));
}